

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

string * lest::to_string_abi_cxx11_(double value)

{
  string *in_RDI;
  string local_38;
  double local_18;
  
  make_value_string<double>(&local_38,&local_18);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p == &local_38.field_2) {
    (in_RDI->field_2)._M_allocated_capacity =
         CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,local_38.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_38.field_2._8_8_;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = local_38._M_dataplus._M_p;
    (in_RDI->field_2)._M_allocated_capacity =
         CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,local_38.field_2._M_local_buf[0]);
  }
  in_RDI->_M_string_length = local_38._M_string_length;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::~string((string *)&local_38);
  return in_RDI;
}

Assistant:

inline std::string to_string(         double        value ) { return make_value_string( value ) ;             }